

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_form_ball(REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_CELL pRVar2;
  REF_INT *pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  REF_NODE pRVar6;
  uint uVar7;
  REF_STATUS RVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  REF_INT RVar15;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  int local_80;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  REF_INT local_5c;
  REF_NODE local_58;
  int local_4c [3];
  ulong local_40;
  long local_38;
  
  local_58 = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  local_38 = (long)node;
  if (local_58->ref_mpi->id == local_58->part[local_38]) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      pRVar2 = ref_grid->cell[8];
      uVar13 = 0xffffffff;
      if (-1 < node) {
        uVar13 = 0xffffffff;
        if (node < pRVar2->ref_adj->nnode) {
          uVar13 = (ulong)(uint)pRVar2->ref_adj->first[local_38];
        }
      }
      if ((int)uVar13 != -1) {
        RVar15 = pRVar2->ref_adj->item[(int)uVar13].ref;
        local_40 = uVar13;
        do {
          pRVar6 = local_58;
          uVar7 = ref_list_contains(ref_cavity->tet_list,RVar15,&local_68);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x339,"ref_cavity_form_ball",(ulong)uVar7,"have tet?");
            return uVar7;
          }
          if (local_68 != 0) {
            pcVar14 = "added tet twice?";
            uVar9 = 0x33a;
            goto LAB_001a75c6;
          }
          uVar7 = ref_list_push(ref_cavity->tet_list,RVar15);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x33b,"ref_cavity_form_ball",(ulong)uVar7,"save tet");
            return uVar7;
          }
          uVar7 = ref_cell_all_local(pRVar2,pRVar6,RVar15,&local_6c);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x33c,"ref_cavity_form_ball",(ulong)uVar7,"local cell");
            return uVar7;
          }
          if (local_6c == 0) goto LAB_001a755e;
          if (0 < pRVar2->face_per) {
            lVar10 = 0;
            lVar11 = 0;
            do {
              pRVar3 = pRVar2->c2n;
              iVar1 = pRVar2->size_per;
              pRVar4 = pRVar2->f2n;
              lVar12 = 0;
              do {
                local_4c[lVar12] =
                     pRVar3[(long)*(int *)((long)pRVar4 + lVar12 * 4 + lVar10) +
                            (long)iVar1 * (long)RVar15];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
              if ((((local_4c[0] != node) && (local_4c[1] != node)) && (local_4c[2] != node)) &&
                 (uVar7 = ref_cavity_insert_face(ref_cavity,local_4c), uVar7 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x349,"ref_cavity_form_ball",(ulong)uVar7,"tet side");
                return uVar7;
              }
              lVar11 = lVar11 + 1;
              lVar10 = lVar10 + 0x10;
            } while (lVar11 < pRVar2->face_per);
          }
          pRVar5 = pRVar2->ref_adj->item;
          iVar1 = pRVar5[(int)local_40].next;
          local_40 = (ulong)iVar1;
          if (local_40 == 0xffffffffffffffff) {
            RVar15 = -1;
          }
          else {
            RVar15 = pRVar5[local_40].ref;
          }
        } while (iVar1 != -1);
      }
      pRVar2 = ref_grid->cell[3];
      uVar13 = 0xffffffff;
      if (-1 < node) {
        uVar13 = 0xffffffff;
        if (node < pRVar2->ref_adj->nnode) {
          uVar13 = (ulong)(uint)pRVar2->ref_adj->first[local_38];
        }
      }
      if ((int)uVar13 != -1) {
        RVar15 = pRVar2->ref_adj->item[(int)uVar13].ref;
        do {
          pRVar6 = local_58;
          uVar7 = ref_list_contains(ref_cavity->tri_list,RVar15,&local_68);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x352,"ref_cavity_form_ball",(ulong)uVar7,"have tet?");
            return uVar7;
          }
          if (local_68 != 0) {
            pcVar14 = "added tri twice?";
            uVar9 = 0x353;
LAB_001a75c6:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,uVar9,"ref_cavity_form_ball",pcVar14);
            return 1;
          }
          uVar7 = ref_list_push(ref_cavity->tri_list,RVar15);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x354,"ref_cavity_form_ball",(ulong)uVar7,"save tri");
            return uVar7;
          }
          uVar7 = ref_cell_all_local(pRVar2,pRVar6,RVar15,&local_6c);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x355,"ref_cavity_form_ball",(ulong)uVar7,"local cell");
            return uVar7;
          }
          if (local_6c == 0) goto LAB_001a755e;
          pRVar3 = pRVar2->c2n;
          lVar10 = (long)RVar15;
          lVar11 = pRVar2->size_per * lVar10;
          local_5c = pRVar3[(long)(int)lVar11 + (long)pRVar2->node_per];
          local_64 = pRVar3[lVar11 + 1];
          local_60 = pRVar3[lVar11 + 2];
          if ((local_60 != node && local_64 != node) &&
             (uVar7 = ref_cavity_insert_seg(ref_cavity,&local_64), uVar7 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x360,"ref_cavity_form_ball",(ulong)uVar7,"tri side");
            return uVar7;
          }
          lVar11 = pRVar2->size_per * lVar10;
          local_64 = pRVar2->c2n[lVar11 + 2];
          local_60 = pRVar2->c2n[lVar11];
          if ((local_60 != node && local_64 != node) &&
             (uVar7 = ref_cavity_insert_seg(ref_cavity,&local_64), uVar7 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x366,"ref_cavity_form_ball",(ulong)uVar7,"tri side");
            return uVar7;
          }
          lVar10 = pRVar2->size_per * lVar10;
          local_64 = pRVar2->c2n[lVar10];
          local_60 = pRVar2->c2n[lVar10 + 1];
          if ((local_60 != node && local_64 != node) &&
             (uVar7 = ref_cavity_insert_seg(ref_cavity,&local_64), uVar7 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x36c,"ref_cavity_form_ball",(ulong)uVar7,"tri side");
            return uVar7;
          }
          pRVar5 = pRVar2->ref_adj->item;
          local_80 = (int)uVar13;
          iVar1 = pRVar5[local_80].next;
          uVar13 = (ulong)iVar1;
          if (uVar13 == 0xffffffffffffffff) {
            RVar15 = -1;
          }
          else {
            RVar15 = pRVar5[uVar13].ref;
          }
        } while (iVar1 != -1);
      }
      RVar8 = ref_cavity_verify_face_manifold(ref_cavity);
      if (RVar8 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x370,"ref_cavity_form_ball",1,"ball face manifold");
        return 1;
      }
      RVar8 = ref_cavity_verify_seg_manifold(ref_cavity);
      if (RVar8 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x371,"ref_cavity_form_ball",1,"ball seg manifold");
        return 1;
      }
    }
    else {
      ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
    }
  }
  else {
LAB_001a755e:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_ball(REF_CAVITY ref_cavity,
                                        REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_face, face_node, cell;
  REF_BOOL has_node;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node = (node == face_nodes[0] || node == face_nodes[1] ||
                  node == face_nodes[2]);
      if (!has_node) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tri twice?");
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }

    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
  }

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");

  return REF_SUCCESS;
}